

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_fkhash_trie
          (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 *param_1)

{
  pointer puVar1;
  uint64_t uVar2;
  pointer psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  undefined4 uVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  
  (this->hasher_).univ_size_.mask_ = (param_1->hasher_).univ_size_.mask_;
  uVar8 = *(undefined4 *)&(param_1->hasher_).field_0x4;
  uVar9 = (param_1->hasher_).univ_size_.bits_;
  uVar10 = *(undefined4 *)&(param_1->hasher_).univ_size_.field_0x4;
  (this->hasher_).shift_ = (param_1->hasher_).shift_;
  *(undefined4 *)&(this->hasher_).field_0x4 = uVar8;
  (this->hasher_).univ_size_.bits_ = uVar9;
  *(undefined4 *)&(this->hasher_).univ_size_.field_0x4 = uVar10;
  puVar1 = (param_1->table_).chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar7 = &(param_1->table_).chunks_;
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).width_ = (param_1->table_).width_;
  uVar2 = (param_1->table_).mask_;
  (this->table_).size_ = (param_1->table_).size_;
  (this->table_).mask_ = uVar2;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (&this->aux_cht_,&param_1->aux_cht_);
  psVar3 = (param_1->aux_map_).table_.
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (param_1->aux_map_).max_size_;
  uVar9 = (param_1->aux_map_).capa_size_.bits_;
  uVar8 = *(undefined4 *)&(param_1->aux_map_).capa_size_.field_0x4;
  uVar4 = (param_1->aux_map_).capa_size_.mask_;
  (this->aux_map_).size_ = (param_1->aux_map_).size_;
  (this->aux_map_).max_size_ = uVar2;
  (this->aux_map_).capa_size_.bits_ = uVar9;
  *(undefined4 *)&(this->aux_map_).capa_size_.field_0x4 = uVar8;
  (this->aux_map_).capa_size_.mask_ = uVar4;
  puVar1 = (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ids_).width_ = (param_1->ids_).width_;
  uVar2 = (param_1->ids_).mask_;
  (this->ids_).size_ = (param_1->ids_).size_;
  (this->ids_).mask_ = uVar2;
  uVar2 = param_1->max_size_;
  uVar9 = (param_1->capa_size_).bits_;
  uVar8 = *(undefined4 *)&(param_1->capa_size_).field_0x4;
  uVar4 = (param_1->capa_size_).mask_;
  uVar11 = (param_1->capa_size_).bits_;
  uVar10 = *(undefined4 *)&(param_1->capa_size_).field_0x4;
  uVar5 = (param_1->capa_size_).mask_;
  uVar12 = (param_1->symb_size_).bits_;
  uVar13 = *(undefined4 *)&(param_1->symb_size_).field_0x4;
  uVar6 = (param_1->symb_size_).mask_;
  this->size_ = param_1->size_;
  this->max_size_ = uVar2;
  (this->capa_size_).bits_ = uVar9;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar8;
  (this->capa_size_).mask_ = uVar4;
  (this->capa_size_).bits_ = uVar11;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar10;
  (this->capa_size_).mask_ = uVar5;
  (this->symb_size_).bits_ = uVar12;
  *(undefined4 *)&(this->symb_size_).field_0x4 = uVar13;
  (this->symb_size_).mask_ = uVar6;
  return;
}

Assistant:

compact_fkhash_trie(compact_fkhash_trie&&) noexcept = default;